

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode Curl_ossl_verifyhost(Curl_easy *data,connectdata *conn,X509 *server_cert)

{
  uchar uVar1;
  undefined8 uVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  GENERAL_NAMES *a;
  int *piVar9;
  char *pcVar10;
  size_t sVar11;
  undefined8 extraout_RAX;
  X509_NAME *name;
  X509_NAME_ENTRY *ne;
  ASN1_STRING *x;
  uchar *__dest;
  void *__src;
  long lVar12;
  undefined7 uVar14;
  char *pcVar13;
  int iVar15;
  CURLcode CVar16;
  size_t sVar17;
  bool bVar18;
  byte bVar19;
  byte bVar20;
  uchar *peer_CN;
  in6_addr addr;
  uchar *local_88;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  char *local_68;
  ulong local_60;
  char *local_58;
  char *local_50;
  X509 *local_48;
  undefined1 local_40 [16];
  
  uVar1 = (conn->http_proxy).proxytype;
  if ((uVar1 != '\x02') ||
     (lVar12 = 0x128, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
    lVar12 = 0x98;
  }
  pcVar10 = *(char **)((conn->chunk).hexbuffer + lVar12 + -0x3d);
  if ((uVar1 != '\x02') ||
     (lVar12 = 0x130, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
    lVar12 = 0xa0;
  }
  local_80 = *(undefined8 *)((conn->chunk).hexbuffer + lVar12 + -0x3d);
  local_68 = (char *)strlen(pcVar10);
  if ((((conn->bits).field_0x5 & 8) == 0) || (iVar4 = inet_pton(10,pcVar10,local_40), iVar4 == 0)) {
    iVar4 = inet_pton(2,pcVar10,local_40);
    local_60 = (ulong)((uint)(iVar4 != 0) * 4);
    iVar4 = (uint)(iVar4 != 0) * 5 + 2;
  }
  else {
    iVar4 = 7;
    local_60 = 0x10;
  }
  pcVar13 = (char *)0x0;
  a = (GENERAL_NAMES *)X509_get_ext_d2i((X509 *)server_cert,0x55,(int *)0x0,(int *)0x0);
  local_78 = pcVar10;
  local_48 = (X509 *)server_cert;
  if (a == (GENERAL_NAMES *)0x0) {
    bVar20 = 0;
    bVar19 = 0;
  }
  else {
    iVar5 = OPENSSL_sk_num(a);
    if (iVar5 < 1) {
      bVar20 = 0;
      bVar19 = 0;
    }
    else {
      iVar15 = 1;
      local_50 = (char *)0x0;
      local_58 = (char *)0x0;
      local_70 = 0;
      bVar18 = false;
      do {
        piVar9 = (int *)OPENSSL_sk_value(a);
        iVar6 = *piVar9;
        uVar14 = (undefined7)((ulong)pcVar13 >> 8);
        if (iVar6 == 2) {
          pcVar13 = (char *)CONCAT71(uVar14,1);
          local_50 = pcVar13;
        }
        else if (iVar6 == 7) {
          pcVar13 = (char *)CONCAT71(uVar14,1);
          local_58 = pcVar13;
        }
        if (iVar6 == iVar4) {
          pcVar10 = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar9 + 2));
          iVar6 = ASN1_STRING_length(*(ASN1_STRING **)(piVar9 + 2));
          sVar17 = (size_t)iVar6;
          if (iVar4 == 7) {
            if ((local_60 == sVar17) && (iVar6 = bcmp(pcVar10,local_40,sVar17), iVar6 == 0)) {
              Curl_infof(data," subjectAltName: host \"%s\" matched cert\'s IP address!",local_80);
              local_70 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
            }
          }
          else if (((iVar4 == 2) && (sVar11 = strlen(pcVar10), sVar11 == sVar17)) &&
                  (pcVar13 = local_68,
                  _Var3 = Curl_cert_hostcheck(pcVar10,sVar17,local_78,(size_t)local_68), _Var3)) {
            Curl_infof(data," subjectAltName: host \"%s\" matched cert\'s \"%s\"",local_80,pcVar10);
            bVar18 = true;
            pcVar13 = pcVar10;
          }
        }
      } while ((iVar15 < iVar5) && (iVar15 = iVar15 + 1, !bVar18));
      bVar20 = (byte)local_50 | (byte)local_58;
      bVar19 = bVar18 | (byte)local_70;
    }
    GENERAL_NAMES_free(a);
  }
  uVar2 = local_80;
  if ((bVar19 & 1) != 0) {
    return CURLE_OK;
  }
  if ((bVar20 & 1) != 0) {
    Curl_infof(data," subjectAltName does not match %s",local_80);
    Curl_failf(data,"SSL: no alternative certificate subject name matches target host name \'%s\'",
               uVar2);
    return CURLE_PEER_FAILED_VERIFICATION;
  }
  local_88 = (uchar *)0x0;
  name = X509_get_subject_name(local_48);
  pcVar10 = local_78;
  if (name == (X509_NAME *)0x0) {
    iVar4 = -1;
  }
  else {
    iVar5 = -1;
    do {
      iVar4 = iVar5;
      iVar5 = X509_NAME_get_index_by_NID(name,0xd,iVar4);
    } while (-1 < iVar5);
  }
  if (iVar4 < 0) {
    CVar16 = CURLE_OK;
    sVar17 = 0;
  }
  else {
    ne = X509_NAME_get_entry(name,iVar4);
    x = X509_NAME_ENTRY_get_data(ne);
    if (x == (ASN1_STRING *)0x0) {
      CVar16 = CURLE_OK;
      uVar7 = 0;
    }
    else {
      iVar4 = ASN1_STRING_type(x);
      if (iVar4 == 0xc) {
        uVar7 = ASN1_STRING_length(x);
        CVar16 = CURLE_OK;
        if (-1 < (int)uVar7) {
          __dest = (uchar *)CRYPTO_malloc(uVar7 + 1,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmcurl/lib/vtls/openssl.c"
                                          ,0x867);
          local_88 = __dest;
          if (__dest == (uchar *)0x0) {
            CVar16 = CURLE_OUT_OF_MEMORY;
          }
          else {
            __src = (void *)ASN1_STRING_get0_data(x);
            memcpy(__dest,__src,(ulong)uVar7);
            local_88[uVar7] = '\0';
          }
        }
      }
      else {
        uVar7 = ASN1_STRING_to_UTF8(&local_88,x);
        CVar16 = CURLE_OK;
      }
      if (local_88 != (uchar *)0x0) {
        sVar11 = strlen((char *)local_88);
        uVar8 = curlx_uztosi(sVar11);
        if (uVar8 != uVar7) {
          Curl_failf(data,"SSL: illegal cert name field");
          CVar16 = CURLE_PEER_FAILED_VERIFICATION;
        }
      }
    }
    sVar17 = (size_t)(int)uVar7;
  }
  if (CVar16 == CURLE_OK) {
    if (local_88 == (uchar *)0x0) {
      Curl_failf(data,"SSL: unable to obtain common name from peer certificate");
    }
    else {
      _Var3 = Curl_cert_hostcheck((char *)local_88,sVar17,pcVar10,(size_t)local_68);
      if (_Var3) {
        CVar16 = CURLE_OK;
        Curl_infof(data," common name: %s (matched)");
        goto LAB_00522fd1;
      }
      Curl_failf(data,"SSL: certificate subject name \'%s\' does not match target host name \'%s\'",
                 local_88,local_80);
    }
    CVar16 = CURLE_PEER_FAILED_VERIFICATION;
  }
LAB_00522fd1:
  if (local_88 != (uchar *)0x0) {
    CRYPTO_free(local_88);
  }
  return CVar16;
}

Assistant:

CURLcode Curl_ossl_verifyhost(struct Curl_easy *data, struct connectdata *conn,
                              X509 *server_cert)
{
  bool matched = FALSE;
  int target = GEN_DNS; /* target type, GEN_DNS or GEN_IPADD */
  size_t addrlen = 0;
  STACK_OF(GENERAL_NAME) *altnames;
#ifdef ENABLE_IPV6
  struct in6_addr addr;
#else
  struct in_addr addr;
#endif
  CURLcode result = CURLE_OK;
  bool dNSName = FALSE; /* if a dNSName field exists in the cert */
  bool iPAddress = FALSE; /* if a iPAddress field exists in the cert */
  const char * const hostname = SSL_HOST_NAME();
  const char * const dispname = SSL_HOST_DISPNAME();
  size_t hostlen = strlen(hostname);

#ifdef ENABLE_IPV6
  if(conn->bits.ipv6_ip &&
     Curl_inet_pton(AF_INET6, hostname, &addr)) {
    target = GEN_IPADD;
    addrlen = sizeof(struct in6_addr);
  }
  else
#endif
    if(Curl_inet_pton(AF_INET, hostname, &addr)) {
      target = GEN_IPADD;
      addrlen = sizeof(struct in_addr);
    }

  /* get a "list" of alternative names */
  altnames = X509_get_ext_d2i(server_cert, NID_subject_alt_name, NULL, NULL);

  if(altnames) {
#ifdef OPENSSL_IS_BORINGSSL
    size_t numalts;
    size_t i;
#else
    int numalts;
    int i;
#endif
    bool dnsmatched = FALSE;
    bool ipmatched = FALSE;

    /* get amount of alternatives, RFC2459 claims there MUST be at least
       one, but we don't depend on it... */
    numalts = sk_GENERAL_NAME_num(altnames);

    /* loop through all alternatives - until a dnsmatch */
    for(i = 0; (i < numalts) && !dnsmatched; i++) {
      /* get a handle to alternative name number i */
      const GENERAL_NAME *check = sk_GENERAL_NAME_value(altnames, i);

      if(check->type == GEN_DNS)
        dNSName = TRUE;
      else if(check->type == GEN_IPADD)
        iPAddress = TRUE;

      /* only check alternatives of the same type the target is */
      if(check->type == target) {
        /* get data and length */
        const char *altptr = (char *)ASN1_STRING_get0_data(check->d.ia5);
        size_t altlen = (size_t) ASN1_STRING_length(check->d.ia5);

        switch(target) {
        case GEN_DNS: /* name/pattern comparison */
          /* The OpenSSL man page explicitly says: "In general it cannot be
             assumed that the data returned by ASN1_STRING_data() is null
             terminated or does not contain embedded nulls." But also that
             "The actual format of the data will depend on the actual string
             type itself: for example for an IA5String the data will be ASCII"

             It has been however verified that in 0.9.6 and 0.9.7, IA5String
             is always null-terminated.
          */
          if((altlen == strlen(altptr)) &&
             /* if this isn't true, there was an embedded zero in the name
                string and we cannot match it. */
             subj_alt_hostcheck(data,
                                altptr,
                                altlen, hostname, hostlen, dispname)) {
            dnsmatched = TRUE;
          }
          break;

        case GEN_IPADD: /* IP address comparison */
          /* compare alternative IP address if the data chunk is the same size
             our server IP address is */
          if((altlen == addrlen) && !memcmp(altptr, &addr, altlen)) {
            ipmatched = TRUE;
            infof(data,
                  " subjectAltName: host \"%s\" matched cert's IP address!",
                  dispname);
          }
          break;
        }
      }
    }
    GENERAL_NAMES_free(altnames);

    if(dnsmatched || ipmatched)
      matched = TRUE;
  }

  if(matched)
    /* an alternative name matched */
    ;
  else if(dNSName || iPAddress) {
    infof(data, " subjectAltName does not match %s", dispname);
    failf(data, "SSL: no alternative certificate subject name matches "
          "target host name '%s'", dispname);
    result = CURLE_PEER_FAILED_VERIFICATION;
  }
  else {
    /* we have to look to the last occurrence of a commonName in the
       distinguished one to get the most significant one. */
    int i = -1;
    unsigned char *peer_CN = NULL;
    int peerlen = 0;

    /* The following is done because of a bug in 0.9.6b */
    X509_NAME *name = X509_get_subject_name(server_cert);
    if(name) {
      int j;
      while((j = X509_NAME_get_index_by_NID(name, NID_commonName, i)) >= 0)
        i = j;
    }

    /* we have the name entry and we will now convert this to a string
       that we can use for comparison. Doing this we support BMPstring,
       UTF8, etc. */

    if(i >= 0) {
      ASN1_STRING *tmp =
        X509_NAME_ENTRY_get_data(X509_NAME_get_entry(name, i));

      /* In OpenSSL 0.9.7d and earlier, ASN1_STRING_to_UTF8 fails if the input
         is already UTF-8 encoded. We check for this case and copy the raw
         string manually to avoid the problem. This code can be made
         conditional in the future when OpenSSL has been fixed. */
      if(tmp) {
        if(ASN1_STRING_type(tmp) == V_ASN1_UTF8STRING) {
          peerlen = ASN1_STRING_length(tmp);
          if(peerlen >= 0) {
            peer_CN = OPENSSL_malloc(peerlen + 1);
            if(peer_CN) {
              memcpy(peer_CN, ASN1_STRING_get0_data(tmp), peerlen);
              peer_CN[peerlen] = '\0';
            }
            else
              result = CURLE_OUT_OF_MEMORY;
          }
        }
        else /* not a UTF8 name */
          peerlen = ASN1_STRING_to_UTF8(&peer_CN, tmp);

        if(peer_CN && (curlx_uztosi(strlen((char *)peer_CN)) != peerlen)) {
          /* there was a terminating zero before the end of string, this
             cannot match and we return failure! */
          failf(data, "SSL: illegal cert name field");
          result = CURLE_PEER_FAILED_VERIFICATION;
        }
      }
    }

    if(result)
      /* error already detected, pass through */
      ;
    else if(!peer_CN) {
      failf(data,
            "SSL: unable to obtain common name from peer certificate");
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
    else if(!Curl_cert_hostcheck((const char *)peer_CN,
                                 peerlen, hostname, hostlen)) {
      failf(data, "SSL: certificate subject name '%s' does not match "
            "target host name '%s'", peer_CN, dispname);
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
    else {
      infof(data, " common name: %s (matched)", peer_CN);
    }
    if(peer_CN)
      OPENSSL_free(peer_CN);
  }

  return result;
}